

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

Int64 __thiscall Imf_2_5::Header::writeTo(Header *this,OStream *os,bool isTiled)

{
  int iVar1;
  char *v;
  undefined4 extraout_var;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  string s;
  StdOSStream oss;
  uint local_1fc;
  string local_1f8;
  TypedAttribute<Imf_2_5::PreviewImage> *local_1d8;
  undefined1 local_1d0 [416];
  Int64 IVar2;
  
  local_1d8 = findTypedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::PreviewImage>>(this,"preview");
  p_Var3 = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
  IVar2 = 0;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,(char *)(p_Var3 + 1));
      v = (char *)(**(code **)(**(long **)(p_Var3 + 9) + 0x10))();
      Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,v);
      StdOSStream::StdOSStream((StdOSStream *)local_1d0);
      (**(code **)(**(long **)(p_Var3 + 9) + 0x20))
                (*(long **)(p_Var3 + 9),(StdOSStream *)local_1d0,2);
      StdOSStream::str_abi_cxx11_(&local_1f8,(StdOSStream *)local_1d0);
      local_1fc = (uint)local_1f8._M_string_length;
      (*os->_vptr_OStream[2])(os,&local_1fc,4);
      if (*(TypedAttribute<Imf_2_5::PreviewImage> **)(p_Var3 + 9) == local_1d8) {
        iVar1 = (*os->_vptr_OStream[3])(os);
        IVar2 = CONCAT44(extraout_var,iVar1);
      }
      (*os->_vptr_OStream[2])(os,local_1f8._M_dataplus._M_p,(ulong)(uint)local_1f8._M_string_length)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      local_1d0._0_8_ = &PTR__StdOSStream_00380658;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d0 + 0x28));
      std::ios_base::~ios_base((ios_base *)(local_1d0 + 0x98));
      OStream::~OStream((OStream *)local_1d0);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,"");
  return IVar2;
}

Assistant:

Int64
Header::writeTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, bool isTiled) const
{
    //
    // Write a "magic number" to identify the file as an image file.
    // Write the current file format version number.
    //

    int version = EXR_VERSION;

    //
    // Write all attributes.  If we have a preview image attribute,
    // keep track of its position in the file.
    //

    Int64 previewPosition = 0;

    const Attribute *preview =
	    findTypedAttribute <PreviewImageAttribute> ("preview");

    for (ConstIterator i = begin(); i != end(); ++i)
    {
	//
	// Write the attribute's name and type.
	//

	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, i.name());
	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, i.attribute().typeName());

	//
	// Write the size of the attribute value,
	// and the value itself.
	//

	StdOSStream oss;
	i.attribute().writeValueTo (oss, version);

	std::string s = oss.str();
	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, (int) s.length());

	if (&i.attribute() == preview)
	    previewPosition = os.tellp();

	os.write (s.data(), int(s.length()));
    }

    //
    // Write zero-length attribute name to mark the end of the header.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, "");

    return previewPosition;
}